

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteBlif.c
# Opt level: O1

void Prs_ManWriteBlif(char *pFileName,Vec_Ptr_t *vPrs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Prs_Ntk_t *p;
  int *piVar4;
  uint uVar5;
  FILE *__stream;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  
  if (vPrs->nSize < 1) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)*vPrs->pArray;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(piVar10 + 2),*piVar10);
  Extra_TimeStamp();
  fprintf(__stream,"# Design \"%s\" written by ABC on %s\n\n",pcVar6);
  if (0 < vPrs->nSize) {
    lVar8 = 0;
    do {
      p = (Prs_Ntk_t *)vPrs->pArray[lVar8];
      pcVar6 = Abc_NamStr(p->pStrs,p->iModuleName);
      fprintf(__stream,".model %s\n",pcVar6);
      if ((p->vInouts).nSize != 0) {
        fwrite(".inouts",7,1,__stream);
      }
      if ((p->vInouts).nSize != 0) {
        Prs_ManWriteBlifArray((FILE *)__stream,p,&p->vInouts);
      }
      fwrite(".inputs",7,1,__stream);
      Prs_ManWriteBlifArray((FILE *)__stream,p,&p->vInputs);
      fwrite(".outputs",8,1,__stream);
      Prs_ManWriteBlifArray((FILE *)__stream,p,&p->vOutputs);
      if (0 < (p->vObjs).nSize) {
        lVar11 = 0;
        do {
          piVar10 = (p->vObjs).pArray;
          iVar1 = piVar10[lVar11];
          if (((long)iVar1 < 0) || (iVar2 = (p->vBoxes).nSize, iVar2 <= iVar1)) {
LAB_003ec1c6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar4 = (p->vBoxes).pArray;
          Prs_BoxSignals_V_1 = piVar4[iVar1] - 2;
          iVar3 = piVar10[lVar11];
          lVar9 = (long)iVar3;
          if ((lVar9 < -3) || (iVar2 <= (int)(iVar3 + 3U))) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          Prs_BoxSignals_V_2 = piVar4 + (iVar3 + 3U);
          if (((iVar3 < -1) || (iVar3 == -1)) || (iVar2 <= iVar3)) goto LAB_003ec1c6;
          if (piVar4[lVar9] < 4) {
            __assert_fail("Prs_BoxIONum(p, i) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaWriteBlif.c"
                          ,0x3d,"void Prs_ManWriteBlifLines(FILE *, Prs_Ntk_t *)");
          }
          if ((piVar4[iVar1] & 1U) != 0) {
            __assert_fail("Vec_IntSize(vBox) % 2 == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaWriteBlif.c"
                          ,0x3e,"void Prs_ManWriteBlifLines(FILE *, Prs_Ntk_t *)");
          }
          iVar1 = piVar4[lVar9 + 1];
          if (iVar1 == -1) {
            fwrite(".latch",6,1,__stream);
            if (Prs_BoxSignals_V_1 < 2) goto LAB_003ec1c6;
            pcVar6 = Abc_NamStr(p->pStrs,Prs_BoxSignals_V_2[1]);
            fprintf(__stream," %s",pcVar6);
            if (Prs_BoxSignals_V_1 < 4) goto LAB_003ec1c6;
            pcVar6 = Abc_NamStr(p->pStrs,Prs_BoxSignals_V_2[3]);
            fprintf(__stream," %s",pcVar6);
            if ((((p->vObjs).nSize <= lVar11) || (iVar1 = (p->vObjs).pArray[lVar11], iVar1 < -2)) ||
               (uVar5 = iVar1 + 2, (p->vBoxes).nSize <= (int)uVar5)) goto LAB_003ec1c6;
            fprintf(__stream," %c\n",(ulong)((p->vBoxes).pArray[uVar5] + 0x30));
          }
          else if (*Prs_BoxSignals_V_2 == 0) {
            fwrite(".names",6,1,__stream);
            if (1 < Prs_BoxSignals_V_1) {
              lVar9 = 1;
              do {
                pcVar6 = Abc_NamStr(p->pStrs,Prs_BoxSignals_V_2[lVar9]);
                fprintf(__stream," %s",pcVar6);
                lVar9 = lVar9 + 2;
              } while ((int)lVar9 < Prs_BoxSignals_V_1);
            }
            pcVar6 = Abc_NamStr(p->pFuns,iVar1);
            fprintf(__stream,"\n%s",pcVar6);
          }
          else {
            fwrite(".subckt",7,1,__stream);
            pcVar6 = Abc_NamStr(p->pStrs,iVar1);
            fprintf(__stream," %s",pcVar6);
            if (1 < Prs_BoxSignals_V_1) {
              lVar9 = 1;
              do {
                iVar1 = Prs_BoxSignals_V_2[lVar9];
                pcVar6 = Abc_NamStr(p->pStrs,Prs_BoxSignals_V_2[lVar9 + -1]);
                pcVar7 = Abc_NamStr(p->pStrs,iVar1);
                fprintf(__stream," %s=%s",pcVar6,pcVar7);
                lVar9 = lVar9 + 2;
              } while ((int)lVar9 < Prs_BoxSignals_V_1);
            }
            fputc(10,__stream);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (p->vObjs).nSize);
      }
      fwrite(".end\n\n",6,1,__stream);
      lVar8 = lVar8 + 1;
    } while (lVar8 < vPrs->nSize);
  }
  fclose(__stream);
  return;
}

Assistant:

void Prs_ManWriteBlif( char * pFileName, Vec_Ptr_t * vPrs )
{
    Prs_Ntk_t * pNtk = Prs_ManRoot(vPrs);
    FILE * pFile = fopen( pFileName, "wb" ); int i;
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Design \"%s\" written by ABC on %s\n\n", Prs_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Prs_Ntk_t *, vPrs, pNtk, i )
        Prs_ManWriteBlifNtk( pFile, pNtk );
    fclose( pFile );
}